

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int column_n;
  ImGuiWindow *this;
  ImGuiTable *table;
  ImVec2 IVar4;
  ImDrawList *draw_list;
  ImVec2 pos;
  ImGuiContext *pIVar5;
  ImGuiTableColumn *column;
  bool bVar6;
  ImGuiID id;
  ImU32 IVar7;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *pIVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar13;
  undefined8 in_XMM1_Qa;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ulong uVar17;
  float fVar18;
  ImRect IVar19;
  bool held;
  bool hovered;
  char sort_order_suf [4];
  ImVec2 label_pos;
  ImVec2 label_size;
  bool local_ef;
  bool local_ee;
  char local_ed;
  float local_ec;
  long local_e8;
  char local_dc [4];
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  float fStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [8];
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  float fStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [16];
  ImGuiTableColumn *local_88;
  ImVec2 local_80;
  char *local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar5 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return;
  }
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableHeader() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0xb33,"void ImGui::TableHeader(const char *)");
  }
  column_n = table->CurrentColumn;
  lVar9 = (long)column_n;
  if (lVar9 == -1) {
    __assert_fail("table->CurrentColumn != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0xb34,"void ImGui::TableHeader(const char *)");
  }
  if ((column_n < 0) ||
     (local_88 = (table->Columns).Data + lVar9, (table->Columns).DataEnd <= local_88)) {
    __assert_fail("p >= Data && p < DataEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_internal.h"
                  ,0x24a,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
  }
  pcVar10 = "";
  if (label != (char *)0x0) {
    pcVar10 = label;
  }
  local_78 = FindRenderedTextEnd(pcVar10,(char *)0x0);
  local_68 = CalcTextSize(pcVar10,local_78,true,-1.0);
  local_98._8_4_ = extraout_XMM0_Dc;
  local_98._0_4_ = local_68.x;
  local_98._4_4_ = local_68.y;
  local_98._12_4_ = extraout_XMM0_Dd;
  IVar4 = (this->DC).CursorPos;
  local_70 = IVar4;
  IVar19 = TableGetCellBgRect(table,column_n);
  uStack_b0 = extraout_XMM0_Dc_00;
  local_b8._0_4_ = IVar19.Min.x;
  local_b8._4_4_ = IVar19.Min.y;
  uStack_ac = extraout_XMM0_Dd_00;
  local_a8 = IVar19.Max.x;
  fStack_a4 = IVar19.Max.y;
  uStack_a0 = (uint)in_XMM1_Qa;
  uStack_9c = (uint)((ulong)in_XMM1_Qa >> 0x20);
  fVar13 = table->RowMinHeight - (table->CellPaddingY + table->CellPaddingY);
  uVar11 = -(uint)(fVar13 <= (float)local_98._4_4_);
  local_58 = ZEXT416(~uVar11 & (uint)fVar13 | local_98._4_4_ & uVar11);
  local_dc[0] = '\0';
  local_dc[1] = '\0';
  local_dc[2] = '\0';
  local_dc[3] = '\0';
  local_c8 = IVar4.x;
  fVar13 = 0.0;
  fStack_c4 = 0.0;
  uStack_c0 = 0;
  uStack_bc = 0;
  local_80 = IVar4;
  if (((table->Flags & 8) == 0) || ((local_88->Flags & 0x200) != 0)) {
    local_d8 = 0.0;
    uStack_d4 = 0;
    uStack_d0 = 0;
    uStack_cc = 0;
  }
  else {
    local_d8 = (float)(int)(pIVar5->FontSize * 0.65 + (pIVar5->Style).FramePadding.x);
    uStack_d4 = 0;
    uStack_d0 = 0;
    uStack_cc = 0;
    if ('\0' < local_88->SortOrder) {
      uStack_d4 = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      ImFormatString(local_dc,4,"%d");
      local_ec = (pIVar5->Style).ItemInnerSpacing.x;
      IVar4 = CalcTextSize(local_dc,(char *)0x0,false,-1.0);
      fStack_c4 = IVar4.y;
      fVar13 = IVar4.x + local_ec;
      uStack_c0 = extraout_XMM0_Dc_01;
      uStack_bc = extraout_XMM0_Dd_01;
    }
  }
  column = local_88;
  fVar18 = (float)local_98._0_4_ + local_c8 + fVar13 + local_d8;
  uVar2 = local_88->ContentMaxXHeadersUsed;
  uVar3 = local_88->ContentMaxXHeadersIdeal;
  uVar11 = -(uint)(local_88->WorkMaxX <= (float)uVar2);
  uVar12 = -(uint)(fVar18 <= (float)uVar3);
  uVar17 = CONCAT44(~uVar12 & (uint)fVar18,~uVar11 & (uint)local_88->WorkMaxX) |
           CONCAT44(uVar3 & uVar12,uVar2 & uVar11);
  local_88->ContentMaxXHeadersUsed = (float)(int)uVar17;
  local_88->ContentMaxXHeadersIdeal = (float)(int)(uVar17 >> 0x20);
  if ((table->IsContextPopupOpen == true) && (column_n == table->ContextPopupColumn)) {
    local_ec = (float)(uint)CONCAT11((char)((ushort)table->InstanceInteracted >> 8),
                                     table->InstanceInteracted == table->InstanceCurrent);
  }
  else {
    local_ec = 0.0;
  }
  local_98._0_8_ = pcVar10;
  local_e8 = lVar9;
  local_c8 = fVar13;
  id = ImGuiWindow::GetID(this,pcVar10,(char *)0x0);
  fVar13 = (pIVar5->Style).CellPadding.y;
  fVar13 = fVar13 + fVar13 + (float)local_b8._4_4_ + (float)local_58._0_4_;
  uVar11 = -(uint)(fVar13 <= fStack_a4);
  local_40.Max.y = (float)(uVar11 & (uint)fStack_a4 | ~uVar11 & (uint)fVar13);
  local_40.Min.x = (float)local_b8._0_4_;
  local_40.Min.y = (float)local_b8._4_4_;
  local_40.Max.x = local_a8;
  local_60.x = 0.0;
  local_60.y = (float)local_58._0_4_;
  ItemSize(&local_60,-1.0);
  bVar6 = ItemAdd(&local_40,id,(ImRect *)0x0,0);
  if (!bVar6) {
    return;
  }
  local_ed = ButtonBehavior(&local_40,id,&local_ee,&local_ef,0x1000);
  if (pIVar5->ActiveId != id) {
    SetItemAllowOverlap();
  }
  IVar4 = local_80;
  if (((local_ef | local_ee | local_ec._0_1_) & 1) == 0) {
    uVar11 = 0x2a;
    if ((table->field_0x98 & 1) != 0) goto LAB_00172c8a;
  }
  else {
    uVar11 = 0x1a;
    if (local_ef == false) {
      uVar11 = local_ee & 1 | 0x18;
    }
  }
  IVar7 = GetColorU32(uVar11,1.0);
  TableSetBgColor(3,IVar7,table->CurrentColumn);
LAB_00172c8a:
  RenderNavHighlight(&local_40,id,10);
  if (local_ef == false) {
    (this->DC).CursorPos.y = (pIVar5->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
  }
  else {
    table->HeldHeaderColumn = (ImGuiTableColumnIdx)local_e8;
    (this->DC).CursorPos.y = (pIVar5->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
    if ((((table->Flags & 2) != 0) && (bVar6 = IsMouseDragging(0,-1.0), bVar6)) &&
       (pIVar5->DragDropActive == false)) {
      table->ReorderColumn = (ImGuiTableColumnIdx)local_e8;
      table->InstanceInteracted = table->InstanceCurrent;
      fVar13 = (pIVar5->IO).MouseDelta.x;
      if (fVar13 < 0.0) {
        pIVar1 = &(pIVar5->IO).MousePos;
        if (((pIVar1->x <= (float)local_b8._0_4_ && (float)local_b8._0_4_ != pIVar1->x) &&
            (column->PrevEnabledColumn != -1)) &&
           ((pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                                (&table->Columns,(int)column->PrevEnabledColumn),
            ((pIVar8->Flags | column->Flags) & 0x40U) == 0 &&
            (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
             table->FreezeColumnsRequest <= pIVar8->IndexWithinEnabledSet)))) {
          table->ReorderColumnDir = -1;
        }
        fVar13 = (pIVar5->IO).MouseDelta.x;
      }
      if (((0.0 < fVar13) && (local_a8 < (pIVar5->IO).MousePos.x)) &&
         ((column->NextEnabledColumn != -1 &&
          ((pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                               (&table->Columns,(int)column->NextEnabledColumn),
           ((pIVar8->Flags | column->Flags) & 0x40U) == 0 &&
           (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
            table->FreezeColumnsRequest <= pIVar8->IndexWithinEnabledSet)))))) {
        table->ReorderColumnDir = '\x01';
      }
    }
  }
  fVar13 = IVar4.y;
  local_a8 = (local_a8 - local_d8) - local_c8;
  if (((table->Flags & 8) != 0) && ((column->Flags & 0x200) == 0)) {
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
    if (column->SortOrder != -1) {
      uStack_d4 = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      local_b8._4_4_ = local_b8._4_4_ & (uint)fStack_a4;
      local_b8._0_4_ =
           ~-(uint)(local_a8 <= (float)local_b8._0_4_) & (uint)local_a8 |
           local_b8._0_4_ & -(uint)(local_a8 <= (float)local_b8._0_4_);
      uStack_b0 = uStack_b0 & uStack_a0;
      uStack_ac = uStack_ac & uStack_9c;
      local_d8 = fVar13;
      if ('\0' < column->SortOrder) {
        IVar7 = GetColorU32(0,0.7);
        PushStyleColor(0,IVar7);
        IVar4.y = local_d8;
        IVar4.x = (pIVar5->Style).ItemInnerSpacing.x + (float)local_b8._0_4_;
        RenderText(IVar4,local_dc,(char *)0x0,true);
        PopStyleColor(1);
        local_b8._0_4_ = (float)local_b8._0_4_ + local_c8;
      }
      draw_list = this->DrawList;
      IVar7 = GetColorU32(0,1.0);
      pos.y = local_d8;
      pos.x = (float)local_b8._0_4_;
      RenderArrow(draw_list,pos,IVar7,(column->field_0x65 & 3) == 1 ^ 3,0.65);
      fVar13 = local_d8;
      uVar14 = uStack_d4;
      uVar15 = uStack_d0;
      uVar16 = uStack_cc;
    }
    if ((local_ed != '\0') && ((int)local_e8 != table->ReorderColumn)) {
      local_d8 = fVar13;
      uStack_d4 = uVar14;
      uStack_d0 = uVar15;
      uStack_cc = uVar16;
      sort_direction = TableGetColumnNextSortDirection(column);
      TableSetColumnSortDirection((int)local_e8,sort_direction,(pIVar5->IO).KeyShift);
      fVar13 = local_d8;
    }
  }
  pcVar10 = local_78;
  local_60.y = (float)local_58._0_4_ + fVar13 + (pIVar5->Style).FramePadding.y;
  local_60.x = local_a8;
  RenderTextEllipsis(this->DrawList,&local_70,&local_60,local_a8,local_a8,(char *)local_98._0_8_,
                     local_78,&local_68);
  if (((local_a8 - local_70.x < local_68.x) && (local_ee == true)) &&
     (pIVar5->TooltipSlowDelay <= pIVar5->HoveredIdNotActiveTimer &&
      pIVar5->HoveredIdNotActiveTimer != pIVar5->TooltipSlowDelay)) {
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar10 - local_98._0_4_));
  }
  bVar6 = IsMouseReleased(1);
  lVar9 = local_e8;
  if ((bVar6) && (bVar6 = IsItemHovered(0), bVar6)) {
    TableOpenContextMenu((int)lVar9);
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}